

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O2

double Js::Math::HypotHelper(Arguments *args,ScriptContext *scriptContext)

{
  bool bVar1;
  bool bVar2;
  BOOL BVar3;
  Var aValue;
  double *pdVar4;
  uint counter;
  uint idxArg;
  double dVar5;
  double dVar6;
  double dVar7;
  
  idxArg = 1;
  bVar1 = false;
  dVar6 = 0.0;
  dVar7 = 0.0;
  do {
    if ((*(uint *)&args->Info & 0xffffff) <= idxArg) {
      if (bVar1) {
        pdVar4 = &NumberConstants::NaN;
LAB_00bd81a6:
        dVar6 = *pdVar4;
      }
      else {
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        dVar6 = dVar6 * dVar7;
      }
      return dVar6;
    }
    aValue = Arguments::operator[](args,idxArg);
    dVar5 = JavascriptConversion::ToNumber(aValue,scriptContext);
    bVar2 = JavascriptNumber::IsPosInf(dVar5);
    if ((bVar2) || (bVar2 = JavascriptNumber::IsNegInf(dVar5), bVar2)) {
      pdVar4 = &NumberConstants::POSITIVE_INFINITY;
      goto LAB_00bd81a6;
    }
    if (!bVar1) {
      BVar3 = JavascriptNumber::IsNan(dVar5);
      if (BVar3 == 0) {
        dVar5 = Abs(dVar5);
        if (dVar5 <= dVar6) {
          if ((dVar6 != 0.0) || (NAN(dVar6))) {
            dVar7 = dVar7 + (dVar5 / dVar6) * (dVar5 / dVar6);
          }
        }
        else {
          dVar7 = dVar7 * (dVar6 / dVar5) * (dVar6 / dVar5) + 1.0;
          dVar6 = dVar5;
        }
      }
      else {
        bVar1 = true;
      }
    }
    idxArg = idxArg + 1;
  } while( true );
}

Assistant:

double Math::HypotHelper(Arguments args, ScriptContext *scriptContext)
    {
        // CRT does not have a multiple version of hypot, so we implement it here ourselves.
        bool foundNaN = false;
        double scale = 0;
        double sum = 0;

        //Ignore first argument which is this pointer
        for (uint counter = 1; counter < args.Info.Count; counter++)
        {
            double doubleVal = JavascriptConversion::ToNumber(args[counter], scriptContext);

            if (JavascriptNumber::IsPosInf(doubleVal) || JavascriptNumber::IsNegInf(doubleVal))
            {
                return JavascriptNumber::POSITIVE_INFINITY;
            }

            if (!foundNaN)
            {
                if (JavascriptNumber::IsNan(doubleVal))
                {
                    //Even though we found NaN, we still need to validate none of the other arguments are +Infinity or -Infinity
                    foundNaN = true;
                }
                else
                {
                    doubleVal = Math::Abs(doubleVal);
                    if (scale < doubleVal)
                    {
                        sum = sum * (scale / doubleVal) * (scale / doubleVal) + 1; /* scale/scale === 1*/
                        //change the scale to new max value
                        scale = doubleVal;
                    }
                    else if (scale != 0)
                    {
                        sum += (doubleVal / scale) * (doubleVal / scale);
                    }
                }
            }
        }

        if (foundNaN)
        {
            return JavascriptNumber::NaN;
        }

        return scale * ::sqrt(sum);
    }